

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::ClearEntryPoints(FunctionBody *this)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  Type pcVar2;
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  LoopEntryPointInfo *this_00;
  uint uVar4;
  LoopHeader *pLVar5;
  int i;
  long lVar6;
  ulong uVar7;
  int i_1;
  
  pSVar1 = (this->entryPoints).ptr;
  if (pSVar1 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    for (lVar6 = 0;
        lVar6 < (pSVar1->
                super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                .count; lVar6 = lVar6 + 1) {
      pcVar2 = (((pSVar1->
                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ).
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 .buffer.ptr[lVar6].ptr)->super_RecyclerWeakReferenceBase).strongRef;
      if (pcVar2 != (Type)0x0) {
        (*(code *)**(undefined8 **)pcVar2)();
      }
    }
    pLVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                       ((FunctionProxy *)this);
    if (pLVar5 != (LoopHeader *)0x0) {
      uVar4 = GetLoopCount(this);
      for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
        pSVar3 = pLVar5[uVar7].entryPoints.ptr;
        if (pSVar3 != (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                       *)0x0) {
          for (lVar6 = 0;
              lVar6 < (pSVar3->
                      super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                      .count; lVar6 = lVar6 + 1) {
            this_00 = (pSVar3->
                      super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                      .buffer.ptr[lVar6].ptr;
            if (this_00 != (LoopEntryPointInfo *)0x0) {
              EntryPointInfo::Cleanup(&this_00->super_EntryPointInfo,false,true);
            }
          }
        }
      }
    }
  }
  pSVar1 = (this->entryPoints).ptr;
  lVar6 = (long)(pSVar1->
                super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                .count;
  if (lVar6 != 0) {
    memset((pSVar1->
           super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ).
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
           .buffer.ptr,0,lVar6 << 3);
    (pSVar1->
    super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ).
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
    .count = 0;
  }
  return;
}

Assistant:

void FunctionBody::ClearEntryPoints()
    {
        if (this->entryPoints)
        {
            this->MapEntryPoints([] (int index, FunctionEntryPointInfo* entryPoint)
            {
                if (nullptr != entryPoint)
                {
                    // Finalize = Free up work item if it hasn't been released yet + entry point clean up
                    // isShutdown is false because cleanup is called only in the !isShutdown case
                    entryPoint->Finalize(/*isShutdown*/ false);
                }
            });

            this->MapLoopHeaders([] (uint loopNumber, LoopHeader* header)
            {
                header->MapEntryPoints([] (int index, LoopEntryPointInfo* entryPoint)
                {
                    entryPoint->Cleanup(/*isShutdown*/ false, true /* capture cleanup stack */);
                });
            });
        }

        this->entryPoints->ClearAndZero();
    }